

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDEdge::TaggedEndIndex(ON_SubDEdge *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = 3;
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    if ((this->m_vertex[lVar4] != (ON_SubDVertex *)0x0) &&
       ((byte)(this->m_vertex[lVar4]->m_vertex_tag - Crease) < 3)) {
      if (uVar3 != 3) {
        lVar4 = 2;
      }
      uVar3 = (uint)lVar4;
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar2);
  return uVar3;
}

Assistant:

unsigned int ON_SubDEdge::TaggedEndIndex() const
{
  unsigned int tagged_end_index = 3;
  for (unsigned int evi = 0; evi < 2; evi++)
  {
    const ON_SubDVertex* v = m_vertex[evi];
    if (nullptr == v || false == v->IsDartOrCreaseOrCorner())
      continue;
    tagged_end_index = (3 == tagged_end_index) ? evi : 2;
  }
  return tagged_end_index;
}